

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O2

void __thiscall libtorrent::piece_picker::lock_piece(piece_picker *this,piece_index_t piece)

{
  download_queue_t queue;
  iterator iVar1;
  uint uVar2;
  
  queue = piece_pos::download_queue
                    ((this->m_piece_map).
                     super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                     .
                     super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                     ._M_impl.super__Vector_impl_data._M_start + piece.m_val);
  if (queue.m_val != '\x04') {
    iVar1 = find_dl_piece(this,queue,piece);
    if (iVar1._M_current !=
        *(pointer *)
         ((long)&(this->m_downloads).
                 super_array<libtorrent::aux::container_wrapper<libtorrent::piece_picker::downloading_piece,_int,_std::vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>_>,_4UL>
                 ._M_elems[queue.m_val].
                 super_vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>
                 .
                 super__Vector_base<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>
                 ._M_impl.super__Vector_impl_data + 8)) {
      uVar2 = *(uint *)&(iVar1._M_current)->field_0x6;
      if ((short)uVar2 < 0) {
        *(uint *)&(iVar1._M_current)->field_0x6 = uVar2 & 0xffff7fff;
        this->m_num_passed = this->m_num_passed + -1;
        uVar2 = *(uint *)&(iVar1._M_current)->field_0x6;
      }
      *(uint *)&(iVar1._M_current)->field_0x6 = uVar2 | 0x80000000;
    }
  }
  return;
}

Assistant:

void piece_picker::lock_piece(piece_index_t const piece)
	{
		INVARIANT_CHECK;

#if TORRENT_USE_INVARIANT_CHECKS
		check_piece_state();
#endif

#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "lock_piece(" << piece << ")" << std::endl;
#endif

		auto const state = m_piece_map[piece].download_queue();
		if (state == piece_pos::piece_open) return;
		auto const i = find_dl_piece(state, piece);
		if (i == m_downloads[state].end()) return;

		TORRENT_ASSERT(i->passed_hash_check == false);
		if (i->passed_hash_check)
		{
			// it's not clear why this would happen,
			// but it seems reasonable to not break the
			// accounting over it.
			i->passed_hash_check = false;
			TORRENT_ASSERT(m_num_passed > 0);
			--m_num_passed;
		}

		// prevent this piece from being picked until it's restored
		i->locked = true;
	}